

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.hpp
# Opt level: O2

void __thiscall
CLI::App::_parse_positional
          (App *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  Option *this_00;
  pointer pbVar1;
  pointer puVar2;
  string positional;
  _Head_base<0UL,_CLI::Option_*,_false> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  
  ::std::__cxx11::string::string
            ((string *)&local_60,
             (string *)
             ((args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish + -1));
  puVar2 = (this->options_).
           super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (puVar2 == (this->options_).
                  super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      if ((this->parent_ == (App *)0x0) || (this->fallthrough_ != true)) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::pop_back(args);
        local_68._M_head_impl = local_68._M_head_impl & 0xffffffff00000000;
        ::std::
        vector<std::pair<CLI::detail::Classifer,std::__cxx11::string>,std::allocator<std::pair<CLI::detail::Classifer,std::__cxx11::string>>>
        ::emplace_back<CLI::detail::Classifer,std::__cxx11::string&>
                  ((vector<std::pair<CLI::detail::Classifer,std::__cxx11::string>,std::allocator<std::pair<CLI::detail::Classifer,std::__cxx11::string>>>
                    *)&this->missing_,(Classifer *)&local_68,&local_60);
        if (this->prefix_command_ == true) {
          while (pbVar1 = (args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish,
                (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start != pbVar1) {
            local_68._M_head_impl = local_68._M_head_impl & 0xffffffff00000000;
            ::std::
            vector<std::pair<CLI::detail::Classifer,std::__cxx11::string>,std::allocator<std::pair<CLI::detail::Classifer,std::__cxx11::string>>>
            ::emplace_back<CLI::detail::Classifer,std::__cxx11::string&>
                      ((vector<std::pair<CLI::detail::Classifer,std::__cxx11::string>,std::allocator<std::pair<CLI::detail::Classifer,std::__cxx11::string>>>
                        *)&this->missing_,(Classifer *)&local_68,pbVar1 + -1);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::pop_back(args);
          }
        }
      }
      else {
        _parse_positional(this->parent_,args);
      }
LAB_001243dc:
      ::std::__cxx11::string::~string((string *)&local_60);
      return;
    }
    this_00 = (puVar2->_M_t).super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>.
              _M_t.super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
              super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
    if (((this_00->pname_)._M_string_length != 0) &&
       ((this_00->expected_ < 0 ||
        ((int)((ulong)((long)*(pointer *)
                              ((long)&(this_00->results_).
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              + 8) -
                      (long)(this_00->results_).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start) >> 5) < this_00->expected_)))
       ) {
      ::std::__cxx11::string::string((string *)&local_40,(string *)&local_60);
      Option::add_result(this_00,&local_40);
      ::std::__cxx11::string::~string((string *)&local_40);
      local_68._M_head_impl =
           (puVar2->_M_t).super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t
           .super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
           super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
      ::std::vector<CLI::Option*,std::allocator<CLI::Option*>>::emplace_back<CLI::Option*>
                ((vector<CLI::Option*,std::allocator<CLI::Option*>> *)&this->parse_order_,
                 &local_68._M_head_impl);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::pop_back(args);
      goto LAB_001243dc;
    }
    puVar2 = puVar2 + 1;
  } while( true );
}

Assistant:

void _parse_positional(std::vector<std::string> &args) {

        std::string positional = args.back();
        for(const Option_p &opt : options_) {
            // Eat options, one by one, until done
            if(opt->get_positional() &&
               (static_cast<int>(opt->count()) < opt->get_expected() || opt->get_expected() < 0)) {

                opt->add_result(positional);
                parse_order_.push_back(opt.get());
                args.pop_back();
                return;
            }
        }

        if(parent_ != nullptr && fallthrough_)
            return parent_->_parse_positional(args);
        else {
            args.pop_back();
            missing_.emplace_back(detail::Classifer::NONE, positional);

            if(prefix_command_) {
                while(!args.empty()) {
                    missing_.emplace_back(detail::Classifer::NONE, args.back());
                    args.pop_back();
                }
            }
        }
    }